

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_int64 localtimeOffset(DateTime *p,sqlite3_context *pCtx,int *pRc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  bool bVar4;
  sqlite3_int64 sVar5;
  sqlite3_mutex *psVar6;
  tm *ptVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  undefined8 uVar12;
  time_t t;
  long local_c0;
  DateTime local_b8;
  int local_88;
  int iStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  DateTime local_60;
  
  local_b8.iJD = p->iJD;
  local_b8.Y = p->Y;
  local_b8.M = p->M;
  local_b8.D = p->D;
  local_b8.h = p->h;
  local_b8.m = p->m;
  local_b8.tz = p->tz;
  local_b8.s = p->s;
  local_b8.validJD = p->validJD;
  local_b8.rawS = p->rawS;
  local_b8.validYMD = p->validYMD;
  local_b8.validHMS = p->validHMS;
  local_b8.validTZ = p->validTZ;
  local_b8.tzSet = p->tzSet;
  local_b8.isError = p->isError;
  local_b8._47_1_ = p->field_0x2f;
  computeYMD(&local_b8);
  computeHMS(&local_b8);
  if (local_b8.Y - 0x7f6U < 0xffffffbd) {
    local_b8.Y = 2000;
    local_b8.M = 1;
    local_b8.D = 1;
    local_b8.h = 0;
    local_b8.m = 0;
    local_b8.tz = 0;
    local_b8.s = 0.0;
  }
  else {
    local_b8.s = (double)(int)(local_b8.s + 0.5);
  }
  local_b8._24_8_ = local_b8._24_8_ & 0xffffffff;
  local_b8._40_8_ = local_b8._40_8_ & 0xffffffffffffff00;
  computeJD(&local_b8);
  sVar5 = local_b8.iJD;
  local_c0 = local_b8.iJD / 1000 + -0x3118a36940;
  bVar4 = true;
  iVar8 = 0;
  if (sqlite3Config.bCoreMutex != 0) {
    psVar6 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    if (psVar6 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar6);
      bVar4 = false;
      goto LAB_001c21a1;
    }
  }
  psVar6 = (sqlite3_mutex *)0x0;
LAB_001c21a1:
  ptVar7 = localtime(&local_c0);
  bVar9 = sqlite3Config.bLocaltimeFault != 0;
  if (ptVar7 == (tm *)0x0 || bVar9) {
    uVar12 = 0;
    iVar10 = 1;
    iVar11 = 0x76c;
    dVar3 = 0.0;
  }
  else {
    iVar8 = ptVar7->tm_min;
    uVar12._0_4_ = ptVar7->tm_hour;
    uVar12._4_4_ = ptVar7->tm_mday;
    uVar1 = ptVar7->tm_mon;
    uVar2 = ptVar7->tm_year;
    iVar10 = uVar1 + 1;
    iVar11 = uVar2 + 0x76c;
    dVar3 = (double)ptVar7->tm_sec;
  }
  if (!bVar4) {
    uStack_70 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_88 = iVar10;
    iStack_84 = iVar11;
    local_78 = uVar12;
    (*sqlite3Config.mutex.xMutexLeave)(psVar6);
    uVar12 = local_78;
    iVar10 = local_88;
    iVar11 = iStack_84;
  }
  bVar9 = ptVar7 == (tm *)0x0 || bVar9;
  if (bVar9) {
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr
              (pCtx->pOut,"local time unavailable",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    local_60.iJD = 0;
  }
  else {
    local_60.M = iVar10;
    local_60.Y = iVar11;
    local_60.h = (int)uVar12;
    local_60.D = (int)((ulong)uVar12 >> 0x20);
    local_60.validJD = '\0';
    local_60.rawS = '\0';
    local_60.validYMD = '\x01';
    local_60.validHMS = '\x01';
    local_60.validTZ = '\0';
    local_60.isError = '\0';
    local_60.m = iVar8;
    local_60.s = dVar3;
    computeJD(&local_60);
    local_60.iJD = local_60.iJD - sVar5;
  }
  *pRc = (uint)bVar9;
  return local_60.iJD;
}

Assistant:

static sqlite3_int64 localtimeOffset(
  DateTime *p,                    /* Date at which to calculate offset */
  sqlite3_context *pCtx,          /* Write error here if one occurs */
  int *pRc                        /* OUT: Error code. SQLITE_OK or ERROR */
){
  DateTime x, y;
  time_t t;
  struct tm sLocal;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  x = *p;
  computeYMD_HMS(&x);
  if( x.Y<1971 || x.Y>=2038 ){
    /* EVIDENCE-OF: R-55269-29598 The localtime_r() C function normally only
    ** works for years between 1970 and 2037. For dates outside this range,
    ** SQLite attempts to map the year into an equivalent year within this
    ** range, do the calculation, then map the year back.
    */
    x.Y = 2000;
    x.M = 1;
    x.D = 1;
    x.h = 0;
    x.m = 0;
    x.s = 0.0;
  } else {
    int s = (int)(x.s + 0.5);
    x.s = s;
  }
  x.tz = 0;
  x.validJD = 0;
  computeJD(&x);
  t = (time_t)(x.iJD/1000 - 21086676*(i64)10000);
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    *pRc = SQLITE_ERROR;
    return 0;
  }
  y.Y = sLocal.tm_year + 1900;
  y.M = sLocal.tm_mon + 1;
  y.D = sLocal.tm_mday;
  y.h = sLocal.tm_hour;
  y.m = sLocal.tm_min;
  y.s = sLocal.tm_sec;
  y.validYMD = 1;
  y.validHMS = 1;
  y.validJD = 0;
  y.rawS = 0;
  y.validTZ = 0;
  y.isError = 0;
  computeJD(&y);
  *pRc = SQLITE_OK;
  return y.iJD - x.iJD;
}